

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

JavascriptString *
Js::JavascriptString::RepeatCore
          (JavascriptString *currentString,charcount_t count,ScriptContext *scriptContext)

{
  char16 cVar1;
  uint uVar2;
  code *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 src;
  bool bVar11;
  uint cchUseLength;
  BOOL BVar12;
  undefined4 *puVar13;
  Recycler *this;
  char16 *content;
  JavascriptString *pJVar14;
  char16 *pcVar15;
  ulong uVar16;
  ulong uVar17;
  size_t bufferDstSize;
  size_t sizeInWords;
  long lVar18;
  undefined1 auVar19 [16];
  long lVar20;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined8 extraout_XMM1_Qa_02;
  undefined8 extraout_XMM1_Qa_03;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined8 extraout_XMM1_Qb_02;
  undefined8 extraout_XMM1_Qb_03;
  undefined1 auVar21 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar22 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar23 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar31 [16];
  undefined1 local_80 [8];
  TrackAllocData data;
  
  if (currentString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar13 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0xa34,"(currentString != nullptr)","currentString != nullptr");
    if (!bVar11) goto LAB_00d17c7c;
    *puVar13 = 0;
  }
  if (currentString->m_charLength == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_00;
    in_XMM1._0_8_ = extraout_XMM1_Qa_00;
    *puVar13 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0xa35,"(currentString->GetLength() > 0)",
                                 "currentString->GetLength() > 0");
    if (!bVar11) goto LAB_00d17c7c;
    *puVar13 = 0;
  }
  if (count == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_01;
    in_XMM1._0_8_ = extraout_XMM1_Qa_01;
    *puVar13 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                 ,0xa36,"(count > 0)","count > 0");
    if (!bVar11) goto LAB_00d17c7c;
    *puVar13 = 0;
  }
  data._32_8_ = GetString(currentString);
  uVar2 = currentString->m_charLength;
  uVar16 = (ulong)uVar2;
  uVar17 = count * uVar16;
  cchUseLength = (uint)uVar17;
  if (((int)(uVar17 >> 0x20) != 0) || (0x7ffffffe < cchUseLength)) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
  }
  uVar17 = uVar17 & 0xffffffff;
  sizeInWords = uVar17 + 1;
  local_80 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80b8f38;
  data.filename._0_4_ = 0xa43;
  data.plusSize = sizeInWords;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_80);
  BVar12 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar12 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_02;
    in_XMM1._0_8_ = extraout_XMM1_Qa_02;
    *puVar13 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                 "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar11) goto LAB_00d17c7c;
    *puVar13 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this,uVar17 * 2 + 2);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_03;
    in_XMM1._0_8_ = extraout_XMM1_Qa_03;
    *puVar13 = 1;
    bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                 ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar11) goto LAB_00d17c7c;
    *puVar13 = 0;
  }
  auVar10 = _DAT_00fa8550;
  if (uVar2 == 1) {
    if (cchUseLength != 0) {
      cVar1 = *(char16 *)data._32_8_;
      lVar18 = uVar17 - 1;
      auVar19._8_4_ = (int)lVar18;
      auVar19._0_8_ = lVar18;
      auVar19._12_4_ = (int)((ulong)lVar18 >> 0x20);
      pcVar15 = content + (uVar17 - 1);
      uVar16 = 0;
      auVar21 = pmovsxbq(in_XMM1,0x706);
      auVar22 = pmovsxbq(in_XMM2,0x504);
      auVar23 = pmovsxbq(in_XMM3,0x302);
      auVar24 = pmovsxbq(in_XMM4,0x100);
      auVar19 = auVar19 ^ _DAT_00fa8550;
      do {
        auVar25._8_4_ = (int)uVar16;
        auVar25._0_8_ = uVar16;
        auVar25._12_4_ = (int)(uVar16 >> 0x20);
        auVar27 = (auVar25 | auVar24) ^ auVar10;
        lVar18 = auVar19._0_8_;
        auVar28._0_8_ = -(ulong)(lVar18 < auVar27._0_8_);
        lVar20 = auVar19._8_8_;
        auVar28._8_8_ = -(ulong)(lVar20 < auVar27._8_8_);
        auVar31 = pshuflw(in_XMM9,auVar28,0xe8);
        auVar27._8_4_ = 0xffffffff;
        auVar27._0_8_ = 0xffffffffffffffff;
        auVar27._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar31 ^ auVar27,auVar31 ^ auVar27);
        if ((auVar27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *pcVar15 = cVar1;
        }
        auVar28 = packssdw(auVar28,auVar28);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 ^ auVar31,auVar28 ^ auVar31);
        if ((auVar28 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pcVar15[-1] = cVar1;
        }
        auVar28 = (auVar25 | auVar23) ^ auVar10;
        auVar29._0_8_ = -(ulong)(lVar18 < auVar28._0_8_);
        auVar29._8_8_ = -(ulong)(lVar20 < auVar28._8_8_);
        auVar27 = packssdw(auVar27,auVar29);
        auVar4._8_4_ = 0xffffffff;
        auVar4._0_8_ = 0xffffffffffffffff;
        auVar4._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar4,auVar27 ^ auVar4);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar15[-2] = cVar1;
        }
        auVar28 = pshufhw(auVar29,auVar29,0x84);
        auVar5._8_4_ = 0xffffffff;
        auVar5._0_8_ = 0xffffffffffffffff;
        auVar5._12_4_ = 0xffffffff;
        auVar28 = packssdw(auVar28 ^ auVar5,auVar28 ^ auVar5);
        if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar15[-3] = cVar1;
        }
        auVar28 = (auVar25 | auVar22) ^ auVar10;
        auVar30._0_8_ = -(ulong)(lVar18 < auVar28._0_8_);
        auVar30._8_8_ = -(ulong)(lVar20 < auVar28._8_8_);
        auVar27 = pshuflw(auVar27,auVar30,0xe8);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        in_XMM9 = packssdw(auVar27 ^ auVar6,auVar27 ^ auVar6);
        if ((in_XMM9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          pcVar15[-4] = cVar1;
        }
        auVar27 = packssdw(auVar30,auVar30);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar7,auVar27 ^ auVar7);
        if ((auVar27 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          pcVar15[-5] = cVar1;
        }
        auVar25 = (auVar25 | auVar21) ^ auVar10;
        auVar26._0_8_ = -(ulong)(lVar18 < auVar25._0_8_);
        auVar26._8_8_ = -(ulong)(lVar20 < auVar25._8_8_);
        auVar27 = packssdw(auVar27,auVar26);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar8,auVar27 ^ auVar8);
        if ((auVar27 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          pcVar15[-6] = cVar1;
        }
        auVar27 = pshufhw(auVar26,auVar26,0x84);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar27 = packssdw(auVar27 ^ auVar9,auVar27 ^ auVar9);
        if ((auVar27 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          pcVar15[-7] = cVar1;
        }
        uVar16 = uVar16 + 8;
        pcVar15 = pcVar15 + -8;
      } while ((cchUseLength + 7 & 0xfffffff8) != uVar16);
    }
    pcVar15 = content + uVar17;
  }
  else {
    if (cchUseLength < uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                   ,0xa4e,"(bufferDstSize > currentLength)",
                                   "bufferDstSize > currentLength");
      if (!bVar11) goto LAB_00d17c7c;
      *puVar13 = 0;
    }
    src = data._32_8_;
    pcVar15 = content;
    if (count != 0) {
      do {
        js_wmemcpy_s(pcVar15,sizeInWords,(char16 *)src,uVar16);
        sizeInWords = sizeInWords - uVar16;
        pcVar15 = pcVar15 + uVar16;
        count = count - 1;
      } while (count != 0);
    }
    if (sizeInWords != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar11 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                   ,0xa56,"(bufferDstSize == 1)","bufferDstSize == 1");
      if (!bVar11) {
LAB_00d17c7c:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar13 = 0;
    }
  }
  *pcVar15 = L'\0';
  pJVar14 = NewWithBufferT<Js::LiteralString,false>(content,cchUseLength,scriptContext);
  return pJVar14;
}

Assistant:

JavascriptString* JavascriptString::RepeatCore(JavascriptString* currentString, charcount_t count, ScriptContext* scriptContext)
    {
        Assert(currentString != nullptr);
        Assert(currentString->GetLength() > 0);
        Assert(count > 0);

        const char16* currentRawString = currentString->GetString();
        charcount_t currentLength = currentString->GetLength();

        charcount_t finalBufferCount = 0;
        bool hasOverflow = UInt32Math::Mul(count, currentLength, &finalBufferCount);
        if (hasOverflow || !IsValidCharCount(finalBufferCount))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }
        finalBufferCount = finalBufferCount + 1;

        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, finalBufferCount);

        if (currentLength == 1)
        {
            wmemset(buffer, currentRawString[0], finalBufferCount - 1);
            buffer[finalBufferCount - 1] = '\0';
        }
        else
        {
            char16* bufferDst = buffer;
            size_t bufferDstSize = finalBufferCount;
            AnalysisAssert(bufferDstSize > currentLength);

            for (charcount_t i = 0; i < count; i += 1)
            {
                js_wmemcpy_s(bufferDst, bufferDstSize, currentRawString, currentLength);
                bufferDst += currentLength;
                bufferDstSize -= currentLength;
            }
            Assert(bufferDstSize == 1);
            *bufferDst = '\0';
        }

        return JavascriptString::NewWithBuffer(buffer, finalBufferCount - 1, scriptContext);
    }